

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
       *this)

{
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_> *this_00;
  IEnumerable<int> *pIVar1;
  bool bVar2;
  mapped_type *this_01;
  iterator __begin0;
  iterator __end0;
  key_type_conflict local_115;
  int local_114;
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  *local_110;
  iterator local_108;
  iterator local_c0;
  iterator local_78;
  
  this_00 = &this->source;
  ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Init(&this_00->source);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->result)._M_t);
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::begin
            (&local_108,this_00);
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::end
            (&local_c0,this_00);
  local_110 = this;
  while( true ) {
    IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
    iterator::iterator(&local_78,&local_c0);
    bVar2 = IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
            ::iterator::operator!=(&local_108,&local_78);
    ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::~ConcatState(&local_78.source)
    ;
    if (!bVar2) break;
    pIVar1 = &local_108.source.source1;
    if (local_108.source.s1 == false) {
      pIVar1 = &local_108.source.source2;
    }
    local_114 = (*((pIVar1->state).super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_IState[3])();
    local_115 = std::function<bool_(const_int_&)>::operator()(&this->transformer,&local_114);
    this_01 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_115);
    std::vector<int,_std::allocator<int>_>::push_back(this_01,&local_114);
    IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
    iterator::operator++(&local_108);
  }
  ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::~ConcatState(&local_c0.source);
  ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::~ConcatState(&local_108.source);
  (local_110->current)._M_node =
       (local_110->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}